

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS ref_facelift_tec(REF_FACELIFT ref_facelift,char *filename)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  REF_CELL ref_cell;
  REF_GLOB *pRVar4;
  REF_DBL *pRVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  REF_INT RVar9;
  uint uVar10;
  int iVar11;
  REF_STATUS RVar12;
  uint uVar13;
  FILE *pFVar14;
  REF_INT *pRVar15;
  void *__ptr;
  int *piVar16;
  REF_GEOM pRVar17;
  int *piVar18;
  long lVar19;
  REF_INT **ppRVar20;
  undefined8 uVar21;
  ulong uVar22;
  int iVar23;
  REF_INT RVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  REF_GEOM ref_cell_00;
  char *pcVar28;
  REF_DICT ref_dict_00;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  REF_INT local;
  REF_INT sens;
  REF_DICT ref_dict;
  REF_DBL radius;
  REF_DBL tvalue;
  REF_INT sens_1;
  REF_DBL normal [3];
  REF_DBL param [2];
  REF_INT nodes [27];
  REF_INT local_158;
  int local_154;
  REF_DICT local_150;
  REF_GEOM local_148;
  FILE *local_140;
  REF_DICT local_138;
  REF_GEOM local_130;
  REF_DICT local_128;
  ulong local_120;
  ulong local_118;
  REF_GEOM local_110;
  REF_NODE local_108;
  uint local_fc;
  REF_DBL local_f8;
  REF_DBL local_f0;
  REF_DBL local_e8;
  ulong local_d8;
  REF_FACELIFT local_d0;
  REF_DBL local_c8;
  REF_DBL RStack_c0;
  REF_DBL local_b8;
  ulong local_b0;
  uint local_a8 [30];
  
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x4f5,"ref_facelift_tec","requires indirect facelift");
    RVar12 = 1;
  }
  else {
    pRVar17 = ref_facelift->grid->geom;
    pFVar14 = fopen(filename,"w");
    if (pFVar14 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x4f9,"ref_facelift_tec","unable to open file");
      RVar12 = 2;
    }
    else {
      fwrite("title=\"refine watertight cad displacement\"\n",0x2b,1,pFVar14);
      fwrite("variables = \"x\" \"y\" \"z\" \"d\" \"u\" \"v\" \"dx\" \"dy\" \"dz\"\n",0x33,1,pFVar14
            );
      uVar10 = pRVar17->max;
      if (0 < (long)(int)uVar10) {
        uVar13 = 0x7fffffff;
        uVar27 = 0x80000000;
        lVar25 = 0;
        do {
          if (*(int *)((long)pRVar17->descr + lVar25) == 1) {
            uVar3 = *(uint *)((long)pRVar17->descr + lVar25 + 4);
            if ((int)uVar3 <= (int)uVar13) {
              uVar13 = uVar3;
            }
            if ((int)uVar27 <= (int)uVar3) {
              uVar27 = uVar3;
            }
          }
          lVar25 = lVar25 + 0x18;
        } while ((long)(int)uVar10 * 0x18 != lVar25);
        local_140 = pFVar14;
        local_110 = pRVar17;
        local_d0 = ref_facelift;
        if ((int)uVar13 <= (int)uVar27) {
          do {
            if (ref_facelift->displacement == (REF_DBL *)0x0) {
              pcVar28 = "requires indirect facelift";
              uVar21 = 0x3c7;
LAB_001939b9:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,uVar21,"ref_facelift_edge_tec_zone",pcVar28);
LAB_001939c0:
              uVar10 = 1;
LAB_00193cf5:
              pcVar28 = "tec edge";
              uVar21 = 0x508;
              goto LAB_001941f5;
            }
            local_108 = (REF_NODE)CONCAT44(local_108._4_4_,uVar27);
            ref_cell = ref_facelift->edg_cell;
            local_130 = (REF_GEOM)ref_facelift->grid->node;
            pRVar17 = ref_facelift->grid->geom;
            uVar10 = ref_dict_create(&local_150);
            if (uVar10 != 0) {
              pcVar28 = "create dict";
              uVar21 = 0x3c9;
              goto LAB_00193ceb;
            }
            local_148 = pRVar17;
            if (pRVar17->max < 1) {
              uVar26 = 0xffffffff;
            }
            else {
              pRVar15 = pRVar17->descr;
              uVar26 = 0xffffffff;
              lVar25 = 0;
              uVar22 = 0;
              do {
                if ((*(int *)((long)pRVar15 + lVar25) == 1) &&
                   (*(uint *)((long)pRVar15 + lVar25 + 4) == uVar13)) {
                  uVar10 = ref_dict_store(local_150,*(REF_INT *)((long)pRVar15 + lVar25 + 0x14),
                                          (REF_INT)uVar22);
                  if (uVar10 != 0) {
                    pcVar28 = "mark nodes";
                    uVar21 = 0x3ce;
                    goto LAB_00193ceb;
                  }
                  pRVar15 = local_148->descr;
                  pRVar17 = local_148;
                  if (*(int *)((long)pRVar15 + lVar25 + 0xc) != 0) {
                    if ((int)uVar26 != -1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x3d0,"ref_facelift_edge_tec_zone","should be only one jump per edge",
                             0xffffffffffffffff,(long)(int)uVar26);
                      goto LAB_001939c0;
                    }
                    uVar26 = uVar22 & 0xffffffff;
                  }
                }
                uVar22 = uVar22 + 1;
                lVar25 = lVar25 + 0x18;
              } while ((long)uVar22 < (long)pRVar17->max);
            }
            if (ref_cell->max < 1) {
LAB_00192a2f:
              ref_facelift = local_d0;
              uVar10 = ref_dict_free(local_150);
              if (uVar10 != 0) {
                pcVar28 = "free dict";
                uVar21 = 0x3e1;
LAB_00193ceb:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,uVar21,"ref_facelift_edge_tec_zone",(ulong)uVar10,pcVar28);
                goto LAB_00193cf5;
              }
            }
            else {
              local_120 = (ulong)((uint)((int)uVar26 != -1) + local_150->n);
              RVar24 = 0;
              uVar10 = 0;
              local_d8 = uVar26;
              do {
                RVar12 = ref_cell_nodes(ref_cell,RVar24,(REF_INT *)local_a8);
                uVar26 = local_120;
                pFVar14 = local_140;
                uVar10 = uVar10 + (local_a8[2] == uVar13 && RVar12 == 0);
                RVar24 = RVar24 + 1;
              } while (RVar24 < ref_cell->max);
              iVar11 = (int)local_120;
              if ((iVar11 == 0) || (uVar10 == 0)) goto LAB_00192a2f;
              fprintf(local_140,
                      "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                      (ulong)uVar13,local_120 & 0xffffffff,(ulong)uVar10,"point","felineseg");
              if (iVar11 < 0) {
                pcVar28 = "malloc t of REF_DBL negative";
                uVar21 = 0x3ea;
                goto LAB_001939b9;
              }
              local_b0 = uVar26 & 0xffffffff;
              __ptr = malloc(local_b0 * 8);
              if (__ptr == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x3ea,"ref_facelift_edge_tec_zone","malloc t of REF_DBL NULL");
                uVar10 = 2;
                goto LAB_00193cf5;
              }
              if (0 < ref_cell->max) {
                iVar11 = (int)local_120 + -1;
                RVar24 = 0;
                do {
                  RVar12 = ref_cell_nodes(ref_cell,RVar24,(REF_INT *)local_a8);
                  if ((RVar12 == 0) && (local_a8[2] == uVar13)) {
                    uVar10 = ref_dict_location(local_150,local_a8[0],&local_158);
                    if (uVar10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x3f1,"ref_facelift_edge_tec_zone",(ulong)uVar10,"localize");
                      printf("edg %d %d id %d no edge geom\n",(ulong)local_a8[0],(ulong)local_a8[1],
                             (ulong)local_a8[2]);
                      uVar13 = ref_node_location((REF_NODE)local_130,local_a8[0]);
                      if (uVar13 == 0) {
                        uVar13 = ref_geom_tattle(local_148,local_a8[0]);
                        if (uVar13 == 0) goto LAB_00193cf5;
                        pcVar28 = "tatt";
                        uVar21 = 0x3f0;
                        uVar10 = uVar13;
                      }
                      else {
                        pcVar28 = "loc";
                        uVar21 = 0x3ef;
                        uVar10 = uVar13;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,uVar21,"ref_facelift_edge_tec_zone",(ulong)uVar10,pcVar28);
                      goto LAB_00193cf5;
                    }
                    uVar10 = ref_geom_cell_tuv(local_148,local_a8[0],(REF_INT *)local_a8,1,
                                               (REF_DBL *)&local_128,&local_154);
                    if (uVar10 != 0) {
                      pcVar28 = "from";
                      uVar21 = 0x3f4;
                      goto LAB_00193ceb;
                    }
                    RVar9 = iVar11;
                    if (local_154 != -1) {
                      RVar9 = local_158;
                    }
                    local_158 = RVar9;
                    *(REF_DICT *)((long)__ptr + (long)local_158 * 8) = local_128;
                    uVar10 = ref_dict_location(local_150,local_a8[1],&local_158);
                    if (uVar10 != 0) {
                      pcVar28 = "localize";
                      uVar21 = 0x3f7;
                      goto LAB_00193ceb;
                    }
                    uVar10 = ref_geom_cell_tuv(local_148,local_a8[1],(REF_INT *)local_a8,1,
                                               (REF_DBL *)&local_128,&local_154);
                    if (uVar10 != 0) {
                      pcVar28 = "from";
                      uVar21 = 0x3fa;
                      goto LAB_00193ceb;
                    }
                    RVar9 = iVar11;
                    if (local_154 != -1) {
                      RVar9 = local_158;
                    }
                    local_158 = RVar9;
                    *(REF_DICT *)((long)__ptr + (long)local_158 * 8) = local_128;
                    pFVar14 = local_140;
                  }
                  RVar24 = RVar24 + 1;
                } while (RVar24 < ref_cell->max);
              }
              if (0 < local_150->n) {
                piVar18 = local_150->key;
                piVar16 = local_150->value;
                lVar25 = 0;
                while( true ) {
                  pRVar17 = local_148;
                  lVar19 = (long)*piVar18;
                  iVar11 = *piVar16;
                  local_138 = (REF_DICT)0x0;
                  pRVar5 = local_130->face_seg_per_rad;
                  local_c8 = pRVar5[lVar19 * 0xf];
                  RStack_c0 = pRVar5[lVar19 * 0xf + 1];
                  local_b8 = pRVar5[lVar19 * 0xf + 2];
                  uVar26 = (long)iVar11;
                  if (local_148->model != (void *)0x0) {
                    local_118 = (long)iVar11;
                    uVar10 = ref_egads_edge_curvature
                                       (local_148,iVar11,(REF_DBL *)&local_138,&local_f8);
                    if (uVar10 != 0) {
                      pcVar28 = "curve";
                      uVar21 = 0x406;
                      goto LAB_00193ceb;
                    }
                    if ((double)local_138 <= -(double)local_138) {
                      local_138 = (REF_DICT)-(double)local_138;
                    }
                    uVar10 = ref_egads_eval_at(pRVar17,1,uVar13,
                                               (REF_DBL *)((long)__ptr + lVar25 * 8),&local_c8,
                                               (REF_DBL *)0x0);
                    uVar26 = local_118;
                    pFVar14 = local_140;
                    if (uVar10 != 0) {
                      pcVar28 = "eval at";
                      uVar21 = 0x409;
                      goto LAB_00193ceb;
                    }
                  }
                  dVar2 = local_d0->displacement[uVar26 * 3];
                  pdVar1 = local_d0->displacement + uVar26 * 3 + 1;
                  dVar6 = *pdVar1;
                  dVar7 = pdVar1[1];
                  fprintf(pFVar14," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                          local_c8,RStack_c0,local_b8,
                          SQRT(dVar7 * dVar7 + dVar2 * dVar2 + dVar6 * dVar6),
                          *(undefined8 *)((long)__ptr + lVar25 * 8),0);
                  lVar25 = lVar25 + 1;
                  if (local_150->n <= lVar25) break;
                  piVar18 = local_150->key + lVar25;
                  piVar16 = local_150->value + lVar25;
                }
              }
              ref_facelift = local_d0;
              pRVar17 = local_148;
              iVar11 = (int)local_d8;
              if (iVar11 != -1) {
                lVar25 = (long)local_148->descr[(long)(iVar11 * 6) + 5];
                local_138 = (REF_DICT)0x0;
                pRVar5 = local_130->face_seg_per_rad;
                local_c8 = pRVar5[lVar25 * 0xf];
                RStack_c0 = pRVar5[lVar25 * 0xf + 1];
                local_b8 = pRVar5[lVar25 * 0xf + 2];
                if (local_148->model == (void *)0x0) {
LAB_00192b71:
                  dVar2 = ref_facelift->displacement[iVar11 * 3];
                  pdVar1 = ref_facelift->displacement + (long)(iVar11 * 3) + 1;
                  dVar6 = *pdVar1;
                  dVar7 = pdVar1[1];
                  fprintf(pFVar14," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                          local_c8,RStack_c0,local_b8,
                          SQRT(dVar7 * dVar7 + dVar2 * dVar2 + dVar6 * dVar6),
                          *(undefined8 *)((long)__ptr + local_b0 * 8 + -8),0);
                  goto LAB_00192bd2;
                }
                uVar10 = ref_egads_edge_curvature(local_148,iVar11,(REF_DBL *)&local_138,&local_f8);
                if (uVar10 == 0) {
                  if ((double)local_138 <= -(double)local_138) {
                    local_138 = (REF_DICT)-(double)local_138;
                  }
                  uVar10 = ref_egads_eval_at(pRVar17,1,uVar13,
                                             (REF_DBL *)((long)__ptr + local_b0 * 8 + -8),&local_c8,
                                             (REF_DBL *)0x0);
                  if (uVar10 == 0) {
                    iVar11 = (int)local_d8;
                    pFVar14 = local_140;
                    goto LAB_00192b71;
                  }
                  pcVar28 = "eval at";
                  uVar21 = 0x41d;
                }
                else {
                  pcVar28 = "curve";
                  uVar21 = 0x419;
                }
                goto LAB_00193ceb;
              }
LAB_00192bd2:
              free(__ptr);
              if (0 < ref_cell->max) {
                iVar23 = (int)local_120 + -1;
                iVar11 = 0;
                do {
                  RVar12 = ref_cell_nodes(ref_cell,iVar11,(REF_INT *)local_a8);
                  if ((RVar12 == 0) && (local_a8[2] == uVar13)) {
                    uVar10 = ref_dict_location(local_150,local_a8[0],&local_158);
                    if (uVar10 != 0) {
                      pcVar28 = "localize";
                      uVar21 = 0x42b;
                      goto LAB_00193ceb;
                    }
                    uVar10 = ref_geom_cell_tuv(local_148,local_a8[0],(REF_INT *)local_a8,1,
                                               (REF_DBL *)&local_128,&local_154);
                    if (uVar10 != 0) {
                      pcVar28 = "from";
                      uVar21 = 0x42e;
                      goto LAB_00193ceb;
                    }
                    if (local_154 == -1) {
                      uVar26 = local_120 & 0xffffffff;
                      local_158 = iVar23;
                    }
                    else {
                      uVar26 = (ulong)(local_158 + 1);
                    }
                    fprintf(local_140," %d",uVar26);
                    uVar10 = ref_dict_location(local_150,local_a8[1],&local_158);
                    if (uVar10 != 0) {
                      pcVar28 = "localize";
                      uVar21 = 0x431;
                      goto LAB_00193ceb;
                    }
                    uVar10 = ref_geom_cell_tuv(local_148,local_a8[1],(REF_INT *)local_a8,1,
                                               (REF_DBL *)&local_128,&local_154);
                    pFVar14 = local_140;
                    if (uVar10 != 0) {
                      pcVar28 = "from";
                      uVar21 = 0x434;
                      goto LAB_00193ceb;
                    }
                    if (local_154 == -1) {
                      uVar26 = local_120 & 0xffffffff;
                      local_158 = iVar23;
                    }
                    else {
                      uVar26 = (ulong)(local_158 + 1);
                    }
                    fprintf(local_140," %d",uVar26);
                    fputc(10,pFVar14);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 < ref_cell->max);
              }
              uVar10 = ref_dict_free(local_150);
              if (uVar10 != 0) {
                pcVar28 = "free dict";
                uVar21 = 0x43b;
                goto LAB_00193ceb;
              }
            }
            bVar29 = uVar13 != (uint)local_108;
            uVar13 = uVar13 + 1;
            uVar27 = (uint)local_108;
          } while (bVar29);
          uVar10 = local_110->max;
        }
        pFVar14 = local_140;
        if (0 < (int)uVar10) {
          uVar13 = 0x7fffffff;
          uVar27 = 0x80000000;
          lVar25 = 0;
          do {
            if (*(int *)((long)local_110->descr + lVar25) == 2) {
              uVar3 = *(uint *)((long)local_110->descr + lVar25 + 4);
              if ((int)uVar3 <= (int)uVar13) {
                uVar13 = uVar3;
              }
              if ((int)uVar27 <= (int)uVar3) {
                uVar27 = uVar3;
              }
            }
            lVar25 = lVar25 + 0x18;
          } while ((ulong)uVar10 * 0x18 != lVar25);
          if ((int)uVar13 <= (int)uVar27) {
            do {
              if (ref_facelift->displacement == (REF_DBL *)0x0) {
                pcVar28 = "requires indirect facelift";
                uVar21 = 0x44e;
LAB_00193d3c:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,uVar21,"ref_facelift_face_tec_zone",pcVar28);
                uVar10 = 1;
                goto LAB_001941d4;
              }
              local_148 = (REF_GEOM)ref_facelift->tri_cell;
              local_108 = ref_facelift->grid->node;
              pRVar17 = ref_facelift->grid->geom;
              uVar10 = ref_dict_create(&local_150);
              if (uVar10 != 0) {
                pcVar28 = "create dict";
                uVar21 = 0x450;
LAB_001941ca:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,uVar21,"ref_facelift_face_tec_zone",(ulong)uVar10,pcVar28);
LAB_001941d4:
                pcVar28 = "tec face";
                uVar21 = 0x512;
LAB_001941f5:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,uVar21,"ref_facelift_tec",(ulong)uVar10,pcVar28);
                return uVar10;
              }
              uVar10 = ref_dict_create(&local_128);
              if (uVar10 != 0) {
                pcVar28 = "create dict";
                uVar21 = 0x451;
                goto LAB_001941ca;
              }
              uVar10 = ref_dict_create(&local_138);
              if (uVar10 != 0) {
                pcVar28 = "create dict";
                uVar21 = 0x452;
                goto LAB_001941ca;
              }
              local_158 = 0;
              ref_cell_00 = local_148;
              local_130 = pRVar17;
              if (0 < pRVar17->max) {
                do {
                  pRVar4 = (REF_GLOB *)pRVar17->descr;
                  lVar25 = (long)(local_158 * 6);
                  if ((*(int *)((long)pRVar4 + lVar25 * 4) == 2) &&
                     (*(uint *)((long)pRVar4 + (long)(int)(local_158 * 6 | 1) * 4) == uVar13)) {
                    uVar3 = *(uint *)((long)pRVar4 + (lVar25 + 5) * 4);
                    if (*(int *)((long)pRVar4 + (lVar25 + 4) * 4) == 0) {
                      uVar10 = ref_dict_store(local_150,uVar3,local_158);
                      if (uVar10 != 0) {
                        pcVar28 = "mark nodes";
                        uVar21 = 0x458;
                        goto LAB_001941ca;
                      }
                      ref_cell_00 = local_148;
                      if ((*(int *)((long)pRVar17->descr + ((long)local_158 * 6 + 3) * 4) != 0) &&
                         (uVar10 = ref_dict_store(local_128,uVar3,local_158),
                         ref_cell_00 = local_148, uVar10 != 0)) {
                        pcVar28 = "mark jump";
                        uVar21 = 0x45a;
                        goto LAB_001941ca;
                      }
                    }
                    else if (((-1 < (int)uVar3) &&
                             (piVar18 = (int *)ref_cell_00->segments_per_radian_of_curvature,
                             (int)uVar3 < *piVar18)) &&
                            (iVar11 = *(int *)(*(long *)(piVar18 + 2) + (ulong)uVar3 * 4),
                            iVar11 != -1)) {
                      lVar25 = *(long *)(piVar18 + 4);
                      do {
                        RVar24 = *(REF_INT *)(lVar25 + (long)iVar11 * 8 + 4);
                        uVar10 = ref_cell_nodes((REF_CELL)ref_cell_00,RVar24,(REF_INT *)local_a8);
                        if (uVar10 != 0) {
                          pcVar28 = "nodes";
                          uVar21 = 0x45e;
                          goto LAB_001941ca;
                        }
                        if ((local_a8[3] == uVar13) &&
                           (uVar10 = ref_dict_store(local_138,RVar24,uVar3), uVar10 != 0)) {
                          pcVar28 = "mark degen";
                          uVar21 = 0x460;
                          goto LAB_001941ca;
                        }
                        lVar25 = *(long *)((long)local_148->segments_per_radian_of_curvature + 0x10)
                        ;
                        iVar11 = *(int *)(lVar25 + (long)iVar11 * 8);
                        ref_cell_00 = local_148;
                        ref_facelift = local_d0;
                        pRVar17 = local_130;
                      } while (iVar11 != -1);
                    }
                  }
                  local_158 = local_158 + 1;
                } while (local_158 < pRVar17->max);
              }
              if (*(int *)((long)&ref_cell_00->initial_cell_height + 4) < 1) {
LAB_00193273:
                uVar10 = ref_dict_free(local_138);
                if (uVar10 == 0) {
                  uVar10 = ref_dict_free(local_128);
                  if (uVar10 == 0) {
                    uVar10 = ref_dict_free(local_150);
                    if (uVar10 == 0) goto LAB_001932a9;
                    pcVar28 = "free dict";
                    uVar21 = 0x477;
                  }
                  else {
                    pcVar28 = "free jump";
                    uVar21 = 0x476;
                  }
                }
                else {
                  pcVar28 = "free degen";
                  uVar21 = 0x475;
                }
                goto LAB_001941ca;
              }
              local_d8 = (ulong)local_150->n;
              iVar11 = local_128->n + local_150->n;
              local_120 = CONCAT44(local_120._4_4_,iVar11);
              local_118 = (ulong)(uint)(local_138->n + iVar11);
              iVar11 = 0;
              uVar26 = 0;
              do {
                RVar12 = ref_cell_nodes((REF_CELL)ref_cell_00,iVar11,(REF_INT *)local_a8);
                uVar10 = (int)uVar26 + (uint)(local_a8[3] == uVar13 && RVar12 == 0);
                uVar26 = (ulong)uVar10;
                iVar11 = iVar11 + 1;
                ref_cell_00 = local_148;
              } while (iVar11 < *(int *)((long)&local_148->initial_cell_height + 4));
              iVar11 = (int)local_118;
              if ((iVar11 == 0) || (uVar10 == 0)) goto LAB_00193273;
              fprintf(local_140,
                      "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                      (ulong)uVar13,local_118 & 0xffffffff,uVar26,"point","fetriangle");
              if (iVar11 < 0) {
                pcVar28 = "malloc uv of REF_DBL negative";
                uVar21 = 0x480;
                goto LAB_00193d3c;
              }
              uVar10 = iVar11 * 2;
              pRVar17 = (REF_GEOM)malloc((ulong)uVar10 << 3);
              auVar8 = _DAT_002025c0;
              if (pRVar17 == (REF_GEOM)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x480,"ref_facelift_face_tec_zone","malloc uv of REF_DBL NULL");
                uVar10 = 2;
                goto LAB_001941d4;
              }
              if ((int)uVar10 < 2) {
                uVar10 = 1;
              }
              lVar25 = (ulong)uVar10 - 1;
              auVar30._8_4_ = (int)lVar25;
              auVar30._0_8_ = lVar25;
              auVar30._12_4_ = (int)((ulong)lVar25 >> 0x20);
              auVar30 = auVar30 ^ _DAT_002025c0;
              lVar25 = 0;
              auVar31 = _DAT_002025b0;
              do {
                bVar29 = auVar30._0_4_ < SUB164(auVar31 ^ auVar8,0);
                iVar11 = auVar30._4_4_;
                iVar23 = SUB164(auVar31 ^ auVar8,4);
                if ((bool)(~(iVar11 < iVar23 || iVar23 == iVar11 && bVar29) & 1)) {
                  *(undefined8 *)((long)&pRVar17->n + lVar25) = 0xbff0000000000000;
                }
                if (iVar11 >= iVar23 && (iVar23 != iVar11 || !bVar29)) {
                  *(undefined8 *)((long)&pRVar17->blank + lVar25) = 0xbff0000000000000;
                }
                lVar19 = auVar31._8_8_;
                auVar31._0_8_ = auVar31._0_8_ + 2;
                auVar31._8_8_ = lVar19 + 2;
                lVar25 = lVar25 + 0x10;
              } while ((ulong)(uVar10 + 1 & 0xfffffffe) << 3 != lVar25);
              local_110 = pRVar17;
              if (0 < *(int *)((long)&local_148->initial_cell_height + 4)) {
                RVar24 = 0;
                do {
                  local_118 = CONCAT44(local_118._4_4_,RVar24);
                  RVar12 = ref_cell_nodes((REF_CELL)local_148,RVar24,(REF_INT *)local_a8);
                  if (((RVar12 == 0) && (local_a8[3] == uVar13)) &&
                     (0 < *(int *)&local_148->field_0xc)) {
                    lVar25 = 0;
                    do {
                      pRVar17 = local_130;
                      uVar10 = ref_geom_find(local_130,local_a8[lVar25],2,uVar13,&local_158);
                      if (uVar10 != 0) {
                        pcVar28 = "find";
                        uVar21 = 0x485;
                        goto LAB_001941ca;
                      }
                      uVar10 = ref_geom_cell_tuv(pRVar17,local_a8[lVar25],(REF_INT *)local_a8,2,
                                                 &local_c8,(REF_INT *)&local_fc);
                      if (uVar10 != 0) {
                        pcVar28 = "cell tuv";
                        uVar21 = 0x488;
                        goto LAB_001941ca;
                      }
                      if (pRVar17->descr[(long)local_158 * 6 + 4] == 0) {
                        if (local_fc < 2) {
                          uVar10 = ref_dict_location(local_150,local_a8[lVar25],&local_154);
                          if (uVar10 != 0) {
                            pcVar28 = "localize";
                            uVar21 = 0x48b;
                            goto LAB_001941ca;
                          }
                        }
                        else {
                          uVar10 = ref_dict_location(local_128,local_a8[lVar25],&local_154);
                          if (uVar10 != 0) {
                            pcVar28 = "localize";
                            uVar21 = 0x48e;
                            goto LAB_001941ca;
                          }
                          local_154 = local_154 + (int)local_d8;
                        }
                      }
                      else {
                        uVar10 = ref_dict_location(local_138,(REF_INT)local_118,&local_154);
                        if (uVar10 != 0) {
                          pcVar28 = "localize";
                          uVar21 = 0x492;
                          goto LAB_001941ca;
                        }
                        local_154 = local_154 + (int)local_120;
                      }
                      *(REF_DBL *)(&local_110->n + (long)(local_154 * 2) * 2) = local_c8;
                      *(REF_DBL *)(&local_110->n + (long)(local_154 * 2) * 2 + 2) = RStack_c0;
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < *(int *)&local_148->field_0xc);
                  }
                  RVar24 = (REF_INT)local_118 + 1;
                } while (RVar24 < *(int *)((long)&local_148->initial_cell_height + 4));
              }
              if (local_150->n < 1) {
                iVar11 = -1;
                local_158 = -1;
              }
              else {
                iVar11 = *local_150->key;
                local_158 = *local_150->value;
              }
              pFVar14 = local_140;
              if (0 < local_150->n) {
                pRVar17 = local_110;
                lVar25 = 1;
                do {
                  pRVar5 = local_108->real;
                  lVar19 = (long)(iVar11 * 0xf);
                  local_f8 = pRVar5[lVar19];
                  local_f0 = pRVar5[lVar19 + 1];
                  local_e8 = pRVar5[lVar19 + 2];
                  if ((local_130->model != (void *)0x0) &&
                     (uVar10 = ref_egads_eval_at(local_130,2,uVar13,(REF_DBL *)pRVar17,&local_f8,
                                                 (REF_DBL *)0x0), pFVar14 = local_140, uVar10 != 0))
                  {
                    pcVar28 = "eval at";
                    uVar21 = 0x4a2;
                    goto LAB_001941ca;
                  }
                  dVar2 = ref_facelift->displacement[local_158 * 3];
                  pdVar1 = ref_facelift->displacement + (long)(local_158 * 3) + 1;
                  dVar6 = *pdVar1;
                  dVar7 = pdVar1[1];
                  fprintf(pFVar14," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                          local_f8,local_f0,local_e8,
                          SQRT(dVar7 * dVar7 + dVar2 * dVar2 + dVar6 * dVar6),*(REF_DBL *)pRVar17,
                          *(undefined8 *)&pRVar17->blank);
                  iVar11 = -1;
                  local_158 = -1;
                  if (lVar25 < local_150->n) {
                    iVar11 = local_150->key[lVar25];
                    local_158 = local_150->value[lVar25];
                  }
                  pRVar17 = (REF_GEOM)&pRVar17->descr;
                  bVar29 = lVar25 < local_150->n;
                  lVar25 = lVar25 + 1;
                } while (bVar29);
              }
              if (local_128->n < 1) {
                iVar11 = -1;
                local_158 = -1;
              }
              else {
                iVar11 = *local_128->key;
                local_158 = *local_128->value;
              }
              if (0 < local_128->n) {
                ppRVar20 = (REF_INT **)(&local_110->n + local_d8 * 4);
                lVar25 = 1;
                do {
                  pRVar5 = local_108->real;
                  lVar19 = (long)(iVar11 * 0xf);
                  local_f8 = pRVar5[lVar19];
                  local_f0 = pRVar5[lVar19 + 1];
                  local_e8 = pRVar5[lVar19 + 2];
                  if ((local_130->model != (void *)0x0) &&
                     (uVar10 = ref_egads_eval_at(local_130,2,uVar13,(REF_DBL *)ppRVar20,&local_f8,
                                                 (REF_DBL *)0x0), pFVar14 = local_140, uVar10 != 0))
                  {
                    pcVar28 = "eval at";
                    uVar21 = 0x4b2;
                    goto LAB_001941ca;
                  }
                  dVar2 = ref_facelift->displacement[local_158 * 3];
                  pdVar1 = ref_facelift->displacement + (long)(local_158 * 3) + 1;
                  dVar6 = *pdVar1;
                  dVar7 = pdVar1[1];
                  fprintf(pFVar14," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                          local_f8,local_f0,local_e8,
                          SQRT(dVar7 * dVar7 + dVar2 * dVar2 + dVar6 * dVar6),*ppRVar20,ppRVar20[1])
                  ;
                  iVar11 = -1;
                  local_158 = -1;
                  if (lVar25 < local_128->n) {
                    iVar11 = local_128->key[lVar25];
                    local_158 = local_128->value[lVar25];
                  }
                  ppRVar20 = ppRVar20 + 2;
                  bVar29 = lVar25 < local_128->n;
                  lVar25 = lVar25 + 1;
                } while (bVar29);
              }
              if (0 < local_138->n) {
                uVar3 = *local_138->value;
                uVar10 = ref_geom_find(local_130,uVar3,2,uVar13,&local_158);
                if (uVar10 != 0) {
LAB_00193f6a:
                  pcVar28 = "find";
                  uVar21 = 0x4bc;
                  goto LAB_001941ca;
                }
                ppRVar20 = (REF_INT **)(&local_110->n + (long)(int)local_120 * 4);
                local_118 = 1;
                uVar26 = (ulong)uVar3;
                pRVar17 = local_130;
                while( true ) {
                  pRVar5 = local_108->real;
                  lVar25 = (long)((int)uVar26 * 0xf);
                  local_f8 = pRVar5[lVar25];
                  local_f0 = pRVar5[lVar25 + 1];
                  local_e8 = pRVar5[lVar25 + 2];
                  if ((pRVar17->model != (void *)0x0) &&
                     (uVar10 = ref_egads_eval_at(pRVar17,2,uVar13,(REF_DBL *)ppRVar20,&local_f8,
                                                 (REF_DBL *)0x0), uVar10 != 0)) {
                    pcVar28 = "eval at";
                    uVar21 = 0x4c3;
                    goto LAB_001941ca;
                  }
                  pFVar14 = local_140;
                  dVar2 = ref_facelift->displacement[(long)local_158 * 3];
                  pdVar1 = ref_facelift->displacement + (long)local_158 * 3 + 1;
                  dVar6 = *pdVar1;
                  dVar7 = pdVar1[1];
                  fprintf(local_140," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                          local_f8,local_f0,local_e8,
                          SQRT(dVar7 * dVar7 + dVar2 * dVar2 + dVar6 * dVar6),*ppRVar20,ppRVar20[1])
                  ;
                  uVar26 = local_118;
                  pRVar17 = local_130;
                  if ((long)local_138->n <= (long)local_118) break;
                  local_b0 = (ulong)(uint)local_138->value[local_118];
                  uVar10 = ref_geom_find(local_130,local_138->value[local_118],2,uVar13,&local_158);
                  ppRVar20 = ppRVar20 + 2;
                  local_118 = uVar26 + 1;
                  uVar26 = local_b0;
                  if (uVar10 != 0) goto LAB_00193f6a;
                }
              }
              ref_dict_00 = local_138;
              free(local_110);
              if (0 < *(int *)((long)&local_148->initial_cell_height + 4)) {
                RVar24 = 0;
                do {
                  local_108 = (REF_NODE)CONCAT44(local_108._4_4_,RVar24);
                  RVar12 = ref_cell_nodes((REF_CELL)local_148,RVar24,(REF_INT *)local_a8);
                  if ((RVar12 == 0) && (local_a8[3] == uVar13)) {
                    if (0 < *(int *)&local_148->field_0xc) {
                      lVar25 = 0;
                      do {
                        pRVar17 = local_130;
                        uVar10 = ref_geom_find(local_130,local_a8[lVar25],2,uVar13,&local_158);
                        if (uVar10 != 0) {
                          pcVar28 = "find";
                          uVar21 = 0x4d2;
                          goto LAB_001941ca;
                        }
                        uVar10 = ref_geom_cell_tuv(pRVar17,local_a8[lVar25],(REF_INT *)local_a8,2,
                                                   &local_c8,(REF_INT *)&local_fc);
                        if (uVar10 != 0) {
                          pcVar28 = "cell tuv";
                          uVar21 = 0x4d5;
                          goto LAB_001941ca;
                        }
                        if (pRVar17->descr[(long)local_158 * 6 + 4] == 0) {
                          if (local_fc < 2) {
                            uVar10 = ref_dict_location(local_150,local_a8[lVar25],&local_154);
                            if (uVar10 != 0) {
                              pcVar28 = "localize";
                              uVar21 = 0x4d8;
                              goto LAB_001941ca;
                            }
                          }
                          else {
                            uVar10 = ref_dict_location(local_128,local_a8[lVar25],&local_154);
                            if (uVar10 != 0) {
                              pcVar28 = "localize";
                              uVar21 = 0x4db;
                              goto LAB_001941ca;
                            }
                            local_154 = local_154 + (int)local_d8;
                          }
                        }
                        else {
                          uVar10 = ref_dict_location(local_138,(uint)local_108,&local_154);
                          if (uVar10 != 0) {
                            pcVar28 = "localize";
                            uVar21 = 0x4df;
                            goto LAB_001941ca;
                          }
                          local_154 = local_154 + (int)local_120;
                        }
                        pFVar14 = local_140;
                        fprintf(local_140," %d",(ulong)(local_154 + 1));
                        lVar25 = lVar25 + 1;
                      } while (lVar25 < *(int *)&local_148->field_0xc);
                    }
                    fputc(10,pFVar14);
                  }
                  RVar24 = (uint)local_108 + 1;
                  ref_dict_00 = local_138;
                } while (RVar24 < *(int *)((long)&local_148->initial_cell_height + 4));
              }
              uVar10 = ref_dict_free(ref_dict_00);
              if (uVar10 != 0) {
                pcVar28 = "free degen";
                uVar21 = 0x4e8;
                goto LAB_001941ca;
              }
              uVar10 = ref_dict_free(local_128);
              if (uVar10 != 0) {
                pcVar28 = "free jump";
                uVar21 = 0x4e9;
                goto LAB_001941ca;
              }
              uVar10 = ref_dict_free(local_150);
              if (uVar10 != 0) {
                pcVar28 = "free dict";
                uVar21 = 0x4ea;
                goto LAB_001941ca;
              }
LAB_001932a9:
              bVar29 = uVar13 != uVar27;
              pFVar14 = local_140;
              uVar13 = uVar13 + 1;
            } while (bVar29);
          }
        }
      }
      fclose(pFVar14);
      RVar12 = 0;
    }
  }
  return RVar12;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_tec(REF_FACELIFT ref_facelift,
                                    const char *filename) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  FILE *file;
  REF_INT geom, id, min_id, max_id;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine watertight cad displacement\"\n");
  fprintf(
      file,
      "variables = \"x\" \"y\" \"z\" \"d\" \"u\" \"v\" \"dx\" \"dy\" \"dz\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_edge(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_facelift_edge_tec_zone(ref_facelift, id, file), "tec edge");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_facelift_face_tec_zone(ref_facelift, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}